

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O1

QString * __thiscall
UnixMakefileGenerator::defaultInstall
          (QString *__return_storage_ptr__,UnixMakefileGenerator *this,QString *t)

{
  QMakeProject *pQVar1;
  QString string;
  QString string_00;
  QString string_01;
  QString string_02;
  QString file_00;
  QArrayData *pQVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  QHash<QString,_QMakeLocalFileName> QVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  QList<ProString> *this_00;
  QMakeProject *pQVar17;
  ProStringList *pPVar18;
  qsizetype qVar19;
  QList<ProString> *pQVar20;
  iterator this_01;
  iterator iVar21;
  pointer pPVar22;
  ulong uVar23;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QVar24;
  ProFile *pPVar25;
  undefined1 auVar26 [8];
  char *str;
  undefined1 auVar27 [8];
  long lVar28;
  ProString *pPVar29;
  long in_FS_OFFSET;
  QStringView QVar30;
  QStringView QVar31;
  QByteArrayView QVar32;
  QAnyStringView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  ProString file;
  undefined8 in_stack_fffffffffffffbb8;
  int off;
  undefined4 in_stack_fffffffffffffbcc;
  QMakeProject *local_418;
  QMakeProject *local_400;
  QMakeProject *local_3f8;
  QMakeProject *pQStack_3f0;
  qsizetype local_3e8;
  QString local_3d8;
  QMakeProject *local_3c0;
  QMakeProject *local_3b8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QStack_3b0;
  QString local_3a8;
  undefined1 local_388 [32];
  char (*local_368) [17];
  undefined1 local_358 [8];
  ProString PStack_350;
  undefined1 local_318 [8];
  ProString PStack_310;
  Location *local_2e0;
  QString local_2d8;
  undefined1 local_2b8 [32];
  Data *local_298;
  QMakeLocalFileName *pQStack_290;
  ProKey local_288;
  QString local_258;
  ProString local_238;
  undefined1 local_208 [8];
  QHash<QString,_QMakeLocalFileName> QStack_200;
  QHash<QString,_QList<QString>_> local_1f8;
  undefined1 local_1e8 [16];
  QMakeProject *local_1d8;
  undefined1 local_1c8 [8];
  QMakeProject *pQStack_1c0;
  ProValueMap local_1b8;
  QString local_1b0;
  undefined1 local_198 [16];
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_188;
  QArrayDataPointer<ProString> local_178;
  undefined1 local_158 [16];
  ProValueMap local_148;
  QString local_140;
  undefined1 local_128 [16];
  ProFile *local_118;
  QString local_108;
  ProKey local_e8;
  ProString local_b8;
  undefined1 local_88 [8];
  undefined1 auStack_80 [32];
  Location *local_60;
  QString *local_58;
  Location *local_50;
  QExplicitlySharedDataPointer<QMakeFeatureRoots> local_48;
  ProValueMap local_38;
  
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        )((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           *)(in_FS_OFFSET + 0x28))->ptr;
  bVar11 = comparesEqual(t,"target");
  bVar12 = true;
  if (bVar11) {
    pQVar17 = (this->super_MakefileGenerator).project;
    ProKey::ProKey(&local_e8,"TEMPLATE");
    QMakeEvaluator::first(&local_b8,&pQVar17->super_QMakeEvaluator,&local_e8);
    bVar12 = ProString::operator==(&local_b8,"subdirs");
    if (&(local_b8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_b8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_b8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar12 != false) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_001b34ab;
  }
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_88,&pQVar17->super_QMakeEvaluator,(ProKey *)local_318);
  bVar12 = ProString::operator==((ProString *)local_88,"aux");
  local_418 = (QMakeProject *)CONCAT71(local_418._1_7_,bVar12);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (local_318 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_108.d.d._0_4_ = -0x55555556;
  local_108.d.d._4_4_ = 0xaaaaaaaa;
  local_108.d.ptr._0_4_ = 0xaaaaaaaa;
  local_108.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x13])
            (&local_108,this);
  pQVar17 = (this->super_MakefileGenerator).project;
  PStack_310.m_string.d.d = (Data *)0x2a8b9e;
  local_318 = (undefined1  [8])t;
  ProString::ProString<QString_const&,char_const(&)[11]>
            ((ProString *)local_88,(QStringBuilder<const_QString_&,_const_char_(&)[11]> *)local_318)
  ;
  this_00 = &QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)local_88)->
             super_QList<ProString>;
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_118 = (ProFile *)&DAT_aaaaaaaaaaaaaaaa;
  local_128._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_318,"DESTDIR");
  QMakeEvaluator::first((ProString *)local_88,&pQVar17->super_QMakeEvaluator,(ProKey *)local_318);
  ProString::toQString((QString *)local_128,(ProString *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (local_318 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  pPVar25 = local_118;
  if (local_118 == (ProFile *)0x0) {
    bVar13 = 0;
  }
  else {
    if (local_118 == (ProFile *)0x1) {
      local_140.d.d = (Data *)local_128._0_8_;
      local_140.d.ptr = (char16_t *)local_128._8_8_;
      local_140.d.size = (qsizetype)local_118;
      if ((QMakeEvaluator *)local_128._0_8_ != (QMakeEvaluator *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      QString::QString(&local_140,(QChar *)(local_128._8_8_ + (long)local_118 * 2 + -2),1);
    }
    bVar13 = 1;
    if (local_140.d.size == Option::dir_sep.d.size) {
      QVar30.m_data = local_140.d.ptr;
      QVar30.m_size = local_140.d.size;
      QVar51.m_data = Option::dir_sep.d.ptr;
      QVar51.m_size = Option::dir_sep.d.size;
      bVar13 = QtPrivate::equalStrings(QVar30,QVar51);
      bVar13 = bVar13 ^ 1;
    }
  }
  if ((pPVar25 != (ProFile *)0x0) && ((QMakeEvaluator *)local_140.d.d != (QMakeEvaluator *)0x0)) {
    LOCK();
    ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar13 != 0) {
    QString::append((QString *)local_128);
  }
  local_148.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  local_158._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar17 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_318,"target.path");
  QMakeEvaluator::first((ProString *)local_88,&pQVar17->super_QMakeEvaluator,(ProKey *)local_318);
  ProString::toQString((QString *)local_358,(ProString *)local_88);
  MakefileGenerator::fileFixify
            ((QString *)local_158,&this->super_MakefileGenerator,(QString *)local_358,
             (FileFixifyTypes)0x4,true);
  if (local_358 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_358,2,0x10);
    }
  }
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (local_318 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  if ((ulong)local_148.d.d.ptr < 2) {
    local_88 = (undefined1  [8])local_158._0_8_;
    auStack_80._0_8_ = local_158._8_8_;
    auStack_80._8_8_ = local_148.d.d.ptr;
    if ((QMakeProject *)local_158._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_158._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_158._0_8_)->m_caller)->d + 1;
      UNLOCK();
    }
  }
  else {
    QString::QString((QString *)local_88,
                     (QChar *)(local_158._8_8_ + (long)local_148.d.d.ptr * 2 + -2),1);
  }
  bVar13 = 1;
  if (auStack_80._8_8_ == Option::dir_sep.d.size) {
    QVar31.m_data = (storage_type_conflict *)auStack_80._0_8_;
    QVar31.m_size = auStack_80._8_8_;
    QVar52.m_data = Option::dir_sep.d.ptr;
    QVar52.m_size = Option::dir_sep.d.size;
    bVar13 = QtPrivate::equalStrings(QVar31,QVar52);
    bVar13 = bVar13 ^ 1;
  }
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (bVar13 != 0) {
    QString::append((QString *)local_158);
  }
  local_178.d = (Data *)0x0;
  local_178.ptr = (ProString *)0x0;
  local_178.size = 0;
  local_188.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )&DAT_aaaaaaaaaaaaaaaa;
  local_198._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_198._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar32.m_data = (storage_type *)0x9;
  QVar32.m_size = (qsizetype)local_88;
  QString::fromUtf8(QVar32);
  local_198._0_8_ = local_88;
  local_198._8_8_ = auStack_80._0_8_;
  local_188.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )auStack_80._8_8_;
  pQVar17 = (this->super_MakefileGenerator).project;
  PStack_310.m_string.d.d = (Data *)0x2ac320;
  local_318 = (undefined1  [8])t;
  ProString::ProString<QString_const&,char_const(&)[9]>
            ((ProString *)local_88,(QStringBuilder<const_QString_&,_const_char_(&)[9]> *)local_318);
  pQVar17 = (QMakeProject *)
            QMakeEvaluator::valuesRef(&pQVar17->super_QMakeEvaluator,(ProKey *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLE");
  bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (bVar11) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
    bVar11 = ProString::operator==((ProString *)local_88,"app");
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    if (bVar11) {
      QVar33.m_size = (size_t)"$(QMAKE_TARGET)";
      QVar33.field_0.m_data = local_198;
      QString::assign(QVar33);
      off = 0;
    }
    else {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318)
      ;
      bVar11 = ProString::operator==((ProString *)local_88,"lib");
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if (local_318 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_318,2,0x10);
        }
      }
      off = 0;
      if (bVar11) {
        auVar27 = (undefined1  [8])(this->super_MakefileGenerator).project;
        QVar35.m_data = (storage_type *)0x9;
        QVar35.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar35);
        auVar26 = local_88;
        config_00.m_data = (storage_type_conflict *)auStack_80._0_8_;
        config_00.m_size = auStack_80._8_8_;
        bVar11 = QMakeEvaluator::isActiveConfig((QMakeEvaluator *)auVar27,config_00,false);
        if (bVar11) {
LAB_001b02a2:
          bVar14 = false;
          bVar15 = false;
        }
        else {
          pQVar1 = (this->super_MakefileGenerator).project;
          QVar36.m_data = (storage_type *)0x6;
          QVar36.m_size = (qsizetype)local_88;
          QString::fromUtf8(QVar36);
          auVar27 = local_88;
          config_01.m_data = (storage_type_conflict *)auStack_80._0_8_;
          config_01.m_size = auStack_80._8_8_;
          bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_01,false);
          if (bVar14) goto LAB_001b02a2;
          pQVar1 = (this->super_MakefileGenerator).project;
          QString::QString(&local_1b0,"unversioned_libname");
          config_02.m_data = local_1b0.d.ptr;
          config_02.m_size = local_1b0.d.size;
          bVar15 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_02,false);
          bVar15 = !bVar15;
          bVar14 = true;
        }
        if ((bVar14) && (&(local_1b0.d.d)->super_QArrayData != (QArrayData *)0x0)) {
          LOCK();
          ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1b0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (!bVar11 && auVar27 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d =
               *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)
                        ->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)
                       ->d == 0) {
            QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
          }
        }
        if (auVar26 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auVar26,2,0x10);
          }
        }
        off = 0;
        if (bVar15) {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_HPUX_SHLIB");
          bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88,2,0x10);
            }
          }
          if (bVar11) {
            ProString::ProString((ProString *)local_88,"$(TARGET0)");
            pPVar18 = ProStringList::operator<<((ProStringList *)&local_178,(ProString *)local_88);
            ProString::ProString((ProString *)local_318,"$(TARGET1)");
            pPVar18 = ProStringList::operator<<(pPVar18,(ProString *)local_318);
            ProString::ProString((ProString *)local_358,"$(TARGET2)");
            ProStringList::operator<<(pPVar18,(ProString *)local_358);
            if (local_358 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_358,2,0x10);
              }
            }
            if (local_318 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_318,2,0x10);
              }
            }
          }
          else {
            ProString::ProString((ProString *)local_88,"$(TARGET0)");
            ProStringList::operator<<((ProStringList *)&local_178,(ProString *)local_88);
          }
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            iVar16 = *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d;
            UNLOCK();
            auVar27 = local_88;
            goto joined_r0x001b015a;
          }
        }
      }
    }
  }
  else {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_318,"QMAKE_BUNDLE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
    ProString::toQString((QString *)local_358,(ProString *)local_88);
    uVar5 = local_198._8_8_;
    uVar4 = local_198._0_8_;
    pcVar6 = PStack_350.m_string.d.ptr;
    auVar27 = local_358;
    local_358 = (undefined1  [8])local_198._0_8_;
    local_198._0_8_ = auVar27;
    local_198._8_8_ = PStack_350.m_string.d.d;
    PStack_350.m_string.d.d = (Data *)uVar5;
    PStack_350.m_string.d.ptr = (char16_t *)local_188.d.ptr;
    local_188.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )pcVar6;
    if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )uVar4 !=
        (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )0x0) {
      LOCK();
      *(int *)uVar4 = *(int *)uVar4 + -1;
      UNLOCK();
      if (*(int *)uVar4 == 0) {
        QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
      }
    }
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar34.m_data = (storage_type *)0xd;
    QVar34.m_size = (qsizetype)local_88;
    QString::fromUtf8(QVar34);
    auVar27 = local_88;
    config.m_data = (storage_type_conflict *)auStack_80._0_8_;
    config.m_size = auStack_80._8_8_;
    bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    off = bVar11 + 1;
    if (auVar27 == (undefined1  [8])0x0) goto LAB_001b04c9;
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
    iVar16 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d;
    UNLOCK();
joined_r0x001b015a:
    if (iVar16 == 0) {
      QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
    }
  }
LAB_001b04c9:
  if ((pQVar17->super_QMakeEvaluator).m_current.pro != (ProFile *)0x0) {
    lVar28 = 0;
    pPVar25 = (ProFile *)0x0;
    do {
      PStack_310.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_318 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      PStack_310.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString
                ((QString *)local_318,
                 (ProString *)
                 ((long)*(char16_t **)&(pQVar17->super_QMakeEvaluator).m_debugLevel + lVar28));
      PStack_350.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_358 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      PStack_350.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)local_88,(QChar)0x2f);
      QString::section(local_2b8,(QString *)local_318,(QString *)local_88,0xffffffffffffffff,
                       0xffffffffffffffff,0);
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      auStack_80._16_8_ = local_2b8._16_8_;
      auStack_80._8_8_ = local_2b8._8_8_;
      auStack_80._0_8_ = local_2b8._0_8_;
      local_88 = (undefined1  [8])local_158;
      local_2b8._0_8_ = (QMakeProject *)0x0;
      local_2b8._8_8_ = (QMakeProject *)0x0;
      local_2b8._16_8_ = (QMakeProject *)0x0;
      QStringBuilder<QString_&,_QString>::convertTo<QString>
                ((QString *)&local_288,(QStringBuilder<QString_&,_QString> *)local_88);
      MakefileGenerator::filePrefixRoot
                (&local_238.m_string,&this->super_MakefileGenerator,&local_108,(QString *)&local_288
                );
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_358,this,&local_238);
      if ((QMakeProject *)local_238.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d
             + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d
            == 0) {
          QArrayData::deallocate(&(local_238.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeProject *)local_288.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)->
                  m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)
                       &(local_288.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d +
             -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData
                      )->m_caller)->d == 0) {
          QArrayData::deallocate(&(local_288.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
        }
      }
      if ((__return_storage_ptr__->d).size != 0) {
        QString::append(__return_storage_ptr__,"\n\t",2);
      }
      local_88 = local_318;
      auStack_80._0_8_ = PStack_310.m_string.d.d;
      auStack_80._8_8_ = PStack_310.m_string.d.ptr;
      if (local_318 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + 1;
        UNLOCK();
      }
      string.d.ptr = (char16_t *)pQVar17;
      string.d.d = (Data *)in_stack_fffffffffffffbb8;
      string.d.size._0_4_ = off;
      string.d.size._4_4_ = in_stack_fffffffffffffbcc;
      Option::fixString((QString *)&local_288,string,(uchar)local_88);
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (&local_238,this,&local_288);
      auStack_80._16_8_ = local_238.m_string.d.size;
      auStack_80._8_8_ = local_238.m_string.d.ptr;
      auStack_80._0_8_ = local_238.m_string.d.d;
      local_238.m_string.d.size = 0;
      local_88 = (undefined1  [8])anon_var_dwarf_156ef5;
      local_238.m_string.d.d = (Data *)0x0;
      local_238.m_string.d.ptr = (char16_t *)0x0;
      auStack_80[0x18] = 0x20;
      local_60 = (Location *)local_358;
      ::operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>
                    *)local_88);
      if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
        }
      }
      if ((Data *)local_238.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_238.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_238.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_238.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_238.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeProject *)local_288.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)->
                  m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)
                       &(local_288.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d +
             -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData
                      )->m_caller)->d == 0) {
          QArrayData::deallocate(&(local_288.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if ((this_00->d).size != 0) {
        ProString::ProString((ProString *)local_88,"\n\t");
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
        QList<ProString>::end(this_00);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
      }
      local_238.m_string.d.d = (Data *)0x2a9521;
      local_238.m_string.d.ptr = (char16_t *)local_358;
      ProString::ProString<char_const(&)[14],QString&>
                ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)&local_238);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
      QList<ProString>::end(this_00);
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if (local_358 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_358,2,0x10);
        }
      }
      if (local_318 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_318,2,0x10);
        }
      }
      pPVar25 = (ProFile *)((long)&(pPVar25->m_refCount).m_cnt + 1);
      lVar28 = lVar28 + 0x30;
    } while (pPVar25 < (pQVar17->super_QMakeEvaluator).m_current.pro);
  }
  local_1c8 = (undefined1  [8])local_198._0_8_;
  pQStack_1c0 = (QMakeProject *)local_198._8_8_;
  local_1b8.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )local_188.d.ptr;
  if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )local_198._0_8_ !=
      (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_198._0_8_ = *(int *)local_198._0_8_ + 1;
    UNLOCK();
  }
  if (local_118 != (ProFile *)0x0) {
    local_238.m_string.d.d = (Data *)local_128;
    local_238.m_string.d.ptr = (char16_t *)local_198;
    QStringBuilder<QString_&,_QString_&>::convertTo<QString>
              ((QString *)local_358,(QStringBuilder<QString_&,_QString_&> *)&local_238);
    local_88 = local_358;
    auStack_80._0_8_ = PStack_350.m_string.d.d;
    auStack_80._8_8_ = PStack_350.m_string.d.ptr;
    if (local_358 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + 1;
      UNLOCK();
    }
    string_00.d.ptr = (char16_t *)pQVar17;
    string_00.d.d = (Data *)in_stack_fffffffffffffbb8;
    string_00.d.size._0_4_ = off;
    string_00.d.size._4_4_ = in_stack_fffffffffffffbcc;
    Option::fixString((QString *)local_318,string_00,(uchar)local_88);
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    pQVar1 = pQStack_1c0;
    auVar26 = local_1c8;
    pcVar6 = PStack_310.m_string.d.ptr;
    auVar27 = local_318;
    local_318 = local_1c8;
    local_1c8 = auVar27;
    pQStack_1c0 = (QMakeProject *)PStack_310.m_string.d.d;
    PStack_310.m_string.d.d = (Data *)pQVar1;
    PStack_310.m_string.d.ptr = (char16_t *)local_1b8.d.d.ptr;
    local_1b8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )pcVar6;
    if (auVar26 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar26)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)auVar26,2,0x10);
      }
    }
    if (local_358 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_358,2,0x10);
      }
    }
  }
  local_1d8 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
  local_1e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_358 = (undefined1  [8])local_158;
  PStack_350.m_string.d.d = (Data *)local_198;
  QStringBuilder<QString_&,_QString_&>::convertTo<QString>
            ((QString *)local_318,(QStringBuilder<QString_&,_QString_&> *)local_358);
  MakefileGenerator::fileFixify
            ((QString *)local_88,&this->super_MakefileGenerator,(QString *)local_318,
             (FileFixifyTypes)0x4,true);
  MakefileGenerator::filePrefixRoot
            ((QString *)local_1e8,&this->super_MakefileGenerator,&local_108,(QString *)local_88);
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (local_318 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  local_208 = (undefined1  [8])local_1e8._0_8_;
  QStack_200.d = (Data *)local_1e8._8_8_;
  local_1f8.d = (Data *)local_1d8;
  if ((QMakeProject *)local_1e8._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d + 1;
    UNLOCK();
  }
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (local_88,this,local_1e8);
  uVar10 = auStack_80._8_8_;
  auVar27 = local_88;
  uVar5 = local_1e8._8_8_;
  uVar4 = local_1e8._0_8_;
  local_88 = (undefined1  [8])local_1e8._0_8_;
  local_1e8._0_8_ = auVar27;
  local_1e8._8_8_ = auStack_80._0_8_;
  auStack_80._0_8_ = uVar5;
  auStack_80._8_8_ = local_1d8;
  local_1d8 = (QMakeProject *)uVar10;
  if ((QMakeProject *)uVar4 != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar4)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)uVar4)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar4)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
    }
  }
  if (off != 0) {
    local_288.super_ProString.m_string.d.d = (Data *)0x0;
    local_288.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_288.super_ProString.m_string.d.size = 0;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
    bVar11 = ProString::operator==((ProString *)local_88,"lib");
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    if (bVar11) {
      pQVar1 = (this->super_MakefileGenerator).project;
      QVar37.m_data = (storage_type *)0xe;
      QVar37.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar37);
      auVar27 = local_88;
      config_03.m_data = (storage_type_conflict *)auStack_80._0_8_;
      config_03.m_size = auStack_80._8_8_;
      bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_03,false);
      if (auVar27 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
        }
      }
      if (!bVar11) {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_358,"QMAKE_FRAMEWORK_VERSION");
        QMakeEvaluator::first
                  ((ProString *)local_318,&pQVar1->super_QMakeEvaluator,(ProKey *)local_358);
        local_88 = (undefined1  [8])0x2aa5bc;
        ProString::ProString((ProString *)auStack_80,(ProString *)local_318);
        ::operator+=((QString *)&local_288,(QStringBuilder<const_char_(&)[11],_ProString> *)local_88
                    );
        if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
      }
      QString::append(&local_288,"/$(TARGET)",10);
    }
    else {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_238,"QMAKE_BUNDLE_LOCATION");
      QMakeEvaluator::first
                ((ProString *)local_358,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_238);
      local_318 = (undefined1  [8])0x2a6ddb;
      ProString::ProString(&PStack_310,(ProString *)local_358);
      local_88 = local_318;
      ProString::ProString((ProString *)auStack_80,&PStack_310);
      local_50 = (Location *)0x2aa5d2;
      QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>::
      convertTo<QString>((QString *)local_2b8,
                         (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>
                          *)local_88);
      pcVar6 = local_288.super_ProString.m_string.d.ptr;
      pDVar7 = local_288.super_ProString.m_string.d.d;
      uVar5 = local_2b8._16_8_;
      uVar4 = local_2b8._0_8_;
      local_2b8._0_8_ = local_288.super_ProString.m_string.d.d;
      local_288.super_ProString.m_string.d.d = (Data *)uVar4;
      local_288.super_ProString.m_string.d.ptr = (char16_t *)local_2b8._8_8_;
      local_2b8._8_8_ = pcVar6;
      local_2b8._16_8_ = local_288.super_ProString.m_string.d.size;
      local_288.super_ProString.m_string.d.size = uVar5;
      if ((QMakeProject *)pDVar7 != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)->d +
             -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)->d ==
            0) {
          QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
        }
      }
      if ((QMakeProject *)PStack_310.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(PStack_310.m_string.d.d)->super_QArrayData)->m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)&(PStack_310.m_string.d.d)->super_QArrayData)->m_caller)->
                      d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(PStack_310.m_string.d.d)->super_QArrayData)->m_caller)->d
            == 0) {
          QArrayData::deallocate(&(PStack_310.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_358 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_358,2,0x10);
        }
      }
      if ((QMakeProject *)local_238.m_string.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d
             + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d
            == 0) {
          QArrayData::deallocate(&(local_238.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QString::append((QString *)local_208);
    if (off == 1) {
      if ((__return_storage_ptr__->d).size != 0) {
        QString::append(__return_storage_ptr__,"\n\t",2);
      }
      local_88 = (undefined1  [8])0x2ab58f;
      auStack_80._0_8_ = local_1e8;
      auStack_80._8_8_ = "\n\t";
      ::operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<const_char_(&)[16],_QString_&>,_const_char_(&)[3]>
                    *)local_88);
    }
    else {
      QString::append((QString *)local_1c8);
    }
    if ((QMakeProject *)local_288.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)
               &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)->
                m_caller)->d =
           *(int *)&((DataPointer *)
                    &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)
                     ->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)
                    ->m_caller)->d == 0) {
        QArrayData::deallocate(&(local_288.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (local_88,this,(QMakeProject *)local_1c8);
  uVar4 = auStack_80._8_8_;
  auVar26 = local_88;
  pQVar1 = pQStack_1c0;
  auVar27 = local_1c8;
  uVar9 = pQStack_1c0._4_4_;
  local_88 = local_1c8;
  local_1c8 = auVar26;
  pQStack_1c0 = (QMakeProject *)auStack_80._0_8_;
  auStack_80._0_4_ = SUB84(pQVar1,0);
  auStack_80._4_4_ = uVar9;
  auStack_80._8_8_ = local_1b8.d.d.ptr;
  local_1b8.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
        )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )uVar4;
  if (auVar27 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
    }
  }
  (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
            (local_88,this,local_208);
  uVar4 = auStack_80._8_8_;
  auVar26 = local_88;
  QVar8.d = QStack_200.d;
  auVar27 = local_208;
  local_88 = local_208;
  local_208 = auVar26;
  QStack_200.d._4_4_ = auStack_80._4_4_;
  QStack_200.d._0_4_ = auStack_80._0_4_;
  auStack_80._0_8_ = QVar8.d;
  auStack_80._8_8_ = local_1f8.d;
  local_1f8.d = (Data *)uVar4;
  if (auVar27 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
    }
  }
  local_258.d.d = (Data *)0x0;
  local_258.d.ptr = (char16_t *)0x0;
  local_258.d.size = 0;
  if (off == 1) {
    auStack_80._16_8_ = local_1e8;
LAB_001b1305:
    auStack_80[8] = 0x20;
    local_88 = (undefined1  [8])anon_var_dwarf_156ef5;
    auStack_80._0_8_ = (QMakeProject *)local_1c8;
    ::operator+=(&local_258,
                 (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                  *)local_88);
  }
  else {
    pQVar1 = (this->super_MakefileGenerator).project;
    auVar27 = (undefined1  [8])local_318;
    ProKey::ProKey((ProKey *)auVar27,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)auVar27);
    bVar11 = ProString::operator==((ProString *)local_88,"lib");
    if (bVar11) {
      pQVar1 = (this->super_MakefileGenerator).project;
      QVar38.m_data = (storage_type *)0x9;
      QVar38.m_size = (qsizetype)local_358;
      QString::fromUtf8(QVar38);
      auVar27 = local_358;
      config_04.m_data = (storage_type_conflict *)PStack_350.m_string.d.d;
      config_04.m_size = (qsizetype)PStack_350.m_string.d.ptr;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_04,false);
    }
    else {
      bVar14 = false;
    }
    if (bVar11 && auVar27 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d =
           *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d
           + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d
          == 0) {
        QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
      }
    }
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    if (bVar14 != false) {
      auStack_80._16_8_ = local_208;
      goto LAB_001b1305;
    }
    if (!bVar12) {
      if (off == 2) {
        if ((__return_storage_ptr__->d).size != 0) {
          QString::append(__return_storage_ptr__,"\n\t",2);
        }
        local_358 = (undefined1  [8])anon_var_dwarf_2d71b9;
        PStack_350.m_string.d.d = (Data *)local_208;
        PStack_350.m_string.d.ptr = L"`\"";
        QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
        convertTo<QString>((QString *)local_318,
                           (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                            *)local_358);
        MakefileGenerator::mkdir_p_asstring
                  ((QString *)local_88,&this->super_MakefileGenerator,(QString *)local_318,false);
        QString::append((QString *)__return_storage_ptr__);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
      }
      local_88 = (undefined1  [8])0x2aa5ee;
      auStack_80[8] = 0x20;
      auStack_80._16_8_ = local_208;
      auStack_80._0_8_ = (QMakeProject *)local_1c8;
      ::operator+=(&local_258,
                   (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[21],_QString_&>,_char>,_QString_&>
                    *)local_88);
    }
  }
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
  auVar27 = (undefined1  [8])local_88;
  QMakeEvaluator::first((ProString *)auVar27,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
  bVar11 = ProString::operator==((ProString *)auVar27,"lib");
  if (bVar11) {
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar39.m_data = (storage_type *)0x9;
    QVar39.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar39);
    auVar27 = local_358;
    config_05.m_data = (storage_type_conflict *)PStack_350.m_string.d.d;
    config_05.m_size = (qsizetype)PStack_350.m_string.d.ptr;
    bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_05,false);
    if (bVar14) goto LAB_001b13ae;
    pQVar1 = (this->super_MakefileGenerator).project;
    local_288.super_ProString.m_string.d.ptr = L".CONFIG";
    local_288.super_ProString.m_string.d.d = (Data *)t;
    ProString::ProString<QString_const&,char_const(&)[8]>
              (&local_238,(QStringBuilder<const_QString_&,_const_char_(&)[8]> *)&local_288);
    pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_238)->
               super_QList<ProString>;
    qVar19 = QtPrivate::indexOf<ProString,char[10]>(pQVar20,(char (*) [10])"fix_rpath",0);
    bVar15 = qVar19 != -1;
    bVar14 = true;
  }
  else {
LAB_001b13ae:
    bVar14 = false;
    bVar15 = false;
  }
  if ((bVar14) && ((QMakeProject *)local_238.m_string.d.d != (QMakeProject *)0x0)) {
    LOCK();
    *(int *)&((DataPointer *)
             &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d =
         *(int *)&((DataPointer *)
                  &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d +
         -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_238.m_string.d.d)->super_QArrayData)->m_caller)->d == 0
       ) {
      QArrayData::deallocate(&(local_238.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar11 && auVar27 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d =
         *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d +
         -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d ==
        0) {
      QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
    }
  }
  if (local_88 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_88,2,0x10);
    }
  }
  if (local_318 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  if (bVar15) {
    if ((__return_storage_ptr__->d).size != 0) {
      QString::append(__return_storage_ptr__,"\n\t",2);
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_FIX_RPATH");
    bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (bVar11) {
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_LFLAGS_RPATH");
      bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if (bVar11) goto LAB_001b1783;
      ProKey::ProKey((ProKey *)local_318,"QMAKE_LFLAGS_RPATH");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                (local_358,this,(ProKey *)local_318);
      auStack_80._16_8_ = PStack_350.m_string.d.ptr;
      auStack_80._8_8_ = PStack_350.m_string.d.d;
      auStack_80._0_8_ = local_358;
      PStack_350.m_string.d.ptr = (char16_t *)0x0;
      local_88 = (undefined1  [8])0x2aa621;
      local_358 = (undefined1  [8])0x0;
      PStack_350.m_string.d.d = (Data *)0x0;
      auStack_80._24_8_ = local_158;
      local_60 = (Location *)0x2aacb0;
      local_58 = (QString *)local_208;
      local_50 = (Location *)0x2ab7f4;
      ::operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                    *)local_88);
    }
    else {
      QString::append((QString *)__return_storage_ptr__);
      ProKey::ProKey((ProKey *)local_318,"QMAKE_FIX_RPATH");
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                (local_358,this,(ProKey *)local_318);
      auStack_80._16_8_ = PStack_350.m_string.d.ptr;
      auStack_80._8_8_ = PStack_350.m_string.d.d;
      auStack_80._0_8_ = local_358;
      PStack_350.m_string.d.ptr = (char16_t *)0x0;
      local_88 = (undefined1  [8])0x2aa61d;
      local_358 = (undefined1  [8])0x0;
      PStack_350.m_string.d.d = (Data *)0x0;
      auStack_80[0x18] = 0x20;
      local_60 = (Location *)local_208;
      local_58 = (QString *)CONCAT71(local_58._1_7_,0x20);
      local_50 = local_60;
      ::operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
                    *)local_88);
    }
    uVar4 = auStack_80._0_8_;
    if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar4)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
      }
    }
    if (local_358 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_358,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
  }
  else if ((QMakeProject *)local_258.d.size != (QMakeProject *)0x0) {
    if ((__return_storage_ptr__->d).size != 0) {
      QString::append(__return_storage_ptr__,"\n\t",2);
    }
LAB_001b1783:
    QString::append((QString *)__return_storage_ptr__);
  }
  if (!bVar12) {
    pQVar1 = (this->super_MakefileGenerator).project;
    auVar27 = (undefined1  [8])local_318;
    ProKey::ProKey((ProKey *)auVar27,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)auVar27);
    bVar11 = ProString::operator==((ProString *)local_88,"lib");
    if (bVar11) {
      pQVar1 = (this->super_MakefileGenerator).project;
      QVar40.m_data = (storage_type *)0x9;
      QVar40.m_size = (qsizetype)local_358;
      QString::fromUtf8(QVar40);
      auVar27 = local_358;
      config_06.m_data = (storage_type_conflict *)PStack_350.m_string.d.d;
      config_06.m_size = (qsizetype)PStack_350.m_string.d.ptr;
      bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_06,false);
    }
    else {
      bVar14 = false;
    }
    if (bVar11 && auVar27 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d =
           *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d
           + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d
          == 0) {
        QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
      }
    }
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    auVar27 = (undefined1  [8])(this->super_MakefileGenerator).project;
    if (bVar14 == false) {
      QVar49.m_data = (storage_type *)0xa;
      QVar49.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar49);
      auVar26 = local_88;
      bVar11 = false;
      config_11.m_data = (storage_type_conflict *)auStack_80._0_8_;
      config_11.m_size = auStack_80._8_8_;
      bVar14 = QMakeEvaluator::isActiveConfig((QMakeEvaluator *)auVar27,config_11,false);
      if (bVar14) {
        bVar15 = false;
      }
      else {
        pQVar17 = (this->super_MakefileGenerator).project;
        QVar50.m_data = (storage_type *)0x7;
        QVar50.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar50);
        auVar27 = local_88;
        config_12.m_data = (storage_type_conflict *)auStack_80._0_8_;
        config_12.m_size = auStack_80._8_8_;
        bVar11 = QMakeEvaluator::isActiveConfig(&pQVar17->super_QMakeEvaluator,config_12,false);
        bVar11 = !bVar11;
        if (bVar11) {
          pQVar17 = (this->super_MakefileGenerator).project;
          ProKey::ProKey(&local_288,"QMAKE_STRIP");
          bVar15 = QMakeProject::isEmpty(pQVar17,&local_288);
          bVar15 = !bVar15;
          pQVar17 = (QMakeProject *)auVar26;
        }
        else {
          bVar15 = false;
          pQVar17 = (QMakeProject *)auVar26;
        }
      }
      if ((bVar11) &&
         ((QMakeProject *)local_288.super_ProString.m_string.d.d != (QMakeProject *)0x0)) {
        LOCK();
        *(int *)&((DataPointer *)
                 &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData)->
                  m_caller)->d =
             *(int *)&((DataPointer *)
                      &((QMakeEvaluator *)
                       &(local_288.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d +
             -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_288.super_ProString.m_string.d.d)->super_QArrayData
                      )->m_caller)->d == 0) {
          QArrayData::deallocate(&(local_288.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
      if (!bVar14 && auVar27 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d =
             *(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->
                      d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar27)->super_QMakeEvaluator).m_caller)->d
            == 0) {
          QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
        }
      }
      if (auVar26 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&(((QMakeProject *)auVar26)->super_QMakeEvaluator).m_caller)->d =
             *(int *)&((DataPointer *)&(((QMakeProject *)auVar26)->super_QMakeEvaluator).m_caller)->
                      d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar26)->super_QMakeEvaluator).m_caller)->d
            == 0) {
          QArrayData::deallocate((QArrayData *)auVar26,2,0x10);
        }
      }
      if (bVar15) {
        QString::append(__return_storage_ptr__,"\n\t-$(STRIP)",0xb);
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
        bVar11 = ProString::operator==((ProString *)local_88,"lib");
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
        if (bVar11) {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_LIB");
          bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88,2,0x10);
            }
          }
          if (!bVar11) {
            str = "QMAKE_STRIPFLAGS_LIB";
LAB_001b398f:
            ProKey::ProKey((ProKey *)local_88,str);
            (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0x16])(local_358,this,(ProKey *)local_88);
            PStack_310.m_string.d.size = (qsizetype)PStack_350.m_string.d.ptr;
            PStack_310.m_string.d.ptr = (char16_t *)PStack_350.m_string.d.d;
            PStack_310.m_string.d.d = (Data *)local_358;
            local_318 = (undefined1  [8])0x2adf3e;
            local_358 = (undefined1  [8])0x0;
            PStack_350.m_string.d.d = (Data *)0x0;
            PStack_350.m_string.d.ptr = (char16_t *)0x0;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<const_char_(&)[2],_QString> *)local_318);
            if ((QMakeProject *)PStack_310.m_string.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(PStack_310.m_string.d.d)->super_QArrayData)->m_caller)
                       ->d = *(int *)&((DataPointer *)
                                      &((QMakeEvaluator *)
                                       &(PStack_310.m_string.d.d)->super_QArrayData)->m_caller)->d +
                             -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(PStack_310.m_string.d.d)->super_QArrayData)->
                            m_caller)->d == 0) {
                QArrayData::deallocate(&(PStack_310.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_358 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_358,2,0x10);
              }
            }
            if (local_88 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88,2,0x10);
              }
            }
          }
        }
        else {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
          bVar11 = ProString::operator==((ProString *)local_88,"app");
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88,2,0x10);
            }
          }
          if (local_318 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_318,2,0x10);
            }
          }
          if (bVar11) {
            pQVar1 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_APP");
            bVar11 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
            if (local_88 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_88,2,0x10);
              }
            }
            if (!bVar11) {
              str = "QMAKE_STRIPFLAGS_APP";
              goto LAB_001b398f;
            }
          }
        }
        local_88[0] = 0x20;
        auStack_80._0_8_ = local_208;
        ::operator+=(__return_storage_ptr__,(QStringBuilder<char,_QString_&> *)local_88);
      }
    }
    else {
      ProKey::ProKey((ProKey *)local_88,"QMAKE_RANLIB");
      bVar11 = QMakeProject::isEmpty((QMakeProject *)auVar27,(ProKey *)local_88);
      if (local_88 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_88,2,0x10);
        }
      }
      if (!bVar11) {
        QVar48.m_data = &DAT_0000000c;
        QVar48.m_size = (qsizetype)local_88;
        QString::fromUtf8(QVar48);
        auStack_80._16_8_ = local_208;
        ::operator+=(__return_storage_ptr__,(QStringBuilder<QString,_QString_&> *)local_88);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
      }
    }
  }
  if ((this_00->d).size != 0) {
    ProString::ProString((ProString *)local_88,"\n\t");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
    QList<ProString>::end(this_00);
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
  }
  if (off == 1) {
    local_318 = (undefined1  [8])0x2ab58e;
    PStack_310.m_string.d.d = (Data *)local_1e8;
    ProString::ProString<char_const(&)[17],QString&>
              ((ProString *)local_88,(QStringBuilder<const_char_(&)[17],_QString_&> *)local_318);
LAB_001b1a0b:
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
    QList<ProString>::end(this_00);
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
  }
  else if (!bVar12) {
    local_318 = (undefined1  [8])0x2a9521;
    PStack_310.m_string.d.d = (Data *)local_208;
    ProString::ProString<char_const(&)[14],QString&>
              ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_318);
    goto LAB_001b1a0b;
  }
  if (off == 2) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_318,"DESTDIR");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
    off = auStack_80._20_4_;
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLED_FILES");
    pQVar20 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88)->
               super_QList<ProString>;
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    this_01 = QList<ProString>::begin(pQVar20);
    iVar21 = QList<ProString>::end(pQVar20);
    if (this_01.i != iVar21.i) {
      do {
        local_298 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_290 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
        local_2b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_2b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_2b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_2b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ProString::mid((ProString *)local_2b8,this_01.i,off,-1);
        local_2d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_2d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_388._0_8_ = local_158;
        local_388._8_8_ = (ProString *)local_2b8;
        QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                  ((QString *)local_358,(QStringBuilder<QString_&,_ProString_&> *)local_388);
        MakefileGenerator::fileFixify
                  ((QString *)local_318,&this->super_MakefileGenerator,(QString *)local_358,
                   (FileFixifyTypes)0x4,true);
        MakefileGenerator::filePrefixRoot
                  ((QString *)local_88,&this->super_MakefileGenerator,&local_108,
                   (QString *)local_318);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  ((QMakeFeatureRoots *)&local_2d8,this,(QString *)local_88);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
        if ((__return_storage_ptr__->d).size != 0) {
          QString::append(__return_storage_ptr__,"\n\t",2);
        }
        local_388._0_8_ = anon_var_dwarf_2d71b9;
        local_388._16_8_ = "`\"";
        local_388._8_8_ = (QMakeFeatureRoots *)&local_2d8;
        QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
        convertTo<QString>((QString *)local_358,
                           (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                            *)local_388);
        MakefileGenerator::mkdir_p_asstring
                  ((QString *)local_318,&this->super_MakefileGenerator,(QString *)local_358,false);
        auStack_80._8_8_ = PStack_310.m_string.d.ptr;
        auStack_80._0_8_ = PStack_310.m_string.d.d;
        local_88 = local_318;
        local_318 = (undefined1  [8])0x0;
        PStack_310.m_string.d.d = (Data *)0x0;
        PStack_310.m_string.d.ptr = (char16_t *)0x0;
        auStack_80._16_8_ = "\n\t";
        ::operator+=(__return_storage_ptr__,(QStringBuilder<QString,_const_char_(&)[3]> *)local_88);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_318)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
        local_88 = (undefined1  [8])0x2a9521;
        auStack_80._8_8_ = "\n\t";
        auStack_80._0_8_ = (QMakeFeatureRoots *)&local_2d8;
        ::operator+=(__return_storage_ptr__,
                     (QStringBuilder<QStringBuilder<const_char_(&)[14],_QString_&>,_const_char_(&)[3]>
                      *)local_88);
        MakefileGenerator::escapeFilePath
                  ((ProString *)local_388,&this->super_MakefileGenerator,this_01.i);
        local_358 = (undefined1  [8])anon_var_dwarf_156ef5;
        ProString::ProString(&PStack_350,(ProString *)local_388);
        local_318 = local_358;
        ProString::ProString(&PStack_310,&PStack_350);
        local_2e0 = (Location *)0x2adf3e;
        local_88 = local_318;
        ProString::ProString((ProString *)auStack_80,&PStack_310);
        local_50 = local_2e0;
        local_48.d.ptr =
             (totally_ordered_wrapper<QMakeFeatureRoots_*>)
             (totally_ordered_wrapper<QMakeFeatureRoots_*>)&local_2d8;
        ::operator+=(__return_storage_ptr__,
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
                      *)local_88);
        uVar4 = auStack_80._0_8_;
        if ((QMakeProject *)auStack_80._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_80._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)uVar4)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auStack_80._0_8_,2,0x10);
          }
        }
        if (&(PStack_310.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((PStack_310.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               = ((PStack_310.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((PStack_310.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(PStack_310.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)PStack_350.m_string.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(PStack_350.m_string.d.d)->super_QArrayData)->m_caller)->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)&(PStack_350.m_string.d.d)->super_QArrayData)->m_caller)
                        ->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(PStack_350.m_string.d.d)->super_QArrayData)->m_caller)
                       ->d == 0) {
            QArrayData::deallocate(&(PStack_350.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_388._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_388._0_8_,2,0x10);
          }
        }
        if ((this_00->d).size != 0) {
          ProString::ProString((ProString *)local_88,"\n\t");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88)
          ;
          QList<ProString>::end(this_00);
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88,2,0x10);
            }
          }
        }
        local_318 = (undefined1  [8])0x2a9521;
        PStack_310.m_string.d.d = (Data *)&local_2d8;
        ProString::ProString<char_const(&)[14],QString&>
                  ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_318)
        ;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
        QList<ProString>::end(this_00);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        pQVar17 = (QMakeProject *)this_01.i;
        if ((QMakeProject *)local_2d8.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller
                   )->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d == 0) {
            QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
          }
        }
        this_01.i = (ProString *)
                    &(((QMakeProject *)this_01.i)->super_QMakeEvaluator).m_locationStack.
                     super_QList<QMakeEvaluator::Location>.d.size;
      } while (this_01.i != iVar21.i);
    }
  }
  if (((ProString *)local_178.size != (ProString *)0x0) &&
     ((ProString *)local_178.size != (ProString *)0x0)) {
    lVar28 = 0;
    pPVar29 = (ProString *)0x0;
    do {
      if ((this->super_MakefileGenerator).target_mode < TARG_WIN_MODE) {
        PStack_310.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_318 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        PStack_310.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pPVar22 = QList<ProString>::data((QList<ProString> *)&local_178);
        local_2b8._8_8_ = (long)&(pPVar22->m_string).d.d + lVar28;
        local_2b8._0_8_ = local_128;
        QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                  ((QString *)local_358,(QStringBuilder<QString_&,_ProString_&> *)local_2b8);
        local_88 = local_358;
        auStack_80._0_8_ = PStack_350.m_string.d.d;
        auStack_80._8_8_ = PStack_350.m_string.d.ptr;
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + 1;
          UNLOCK();
        }
        string_01.d.ptr = (char16_t *)pQVar17;
        string_01.d.d = (Data *)in_stack_fffffffffffffbb8;
        string_01.d.size._0_4_ = off;
        string_01.d.size._4_4_ = in_stack_fffffffffffffbcc;
        Option::fixString((QString *)local_318,string_01,(uchar)(ProString *)local_88);
        auVar27 = local_88;
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
        iVar16 = QString::lastIndexOf
                           ((QString *)local_318,0x2e2bf0,(CaseSensitivity)PStack_310.m_string.d.ptr
                           );
        if (iVar16 != -1) {
          QVar24.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                          )((long)PStack_310.m_string.d.ptr - (long)(iVar16 + 1));
          if ((ulong)QVar24.d.ptr < PStack_310.m_string.d.ptr) {
            QString::QString((QString *)local_88,
                             (QChar *)((long)&((DataPointer *)
                                              &((QMakeEvaluator *)
                                               &(PStack_310.m_string.d.d)->super_QArrayData)->
                                               m_caller)->d + (long)(iVar16 + 1) * 2),
                             (longlong)QVar24.d.ptr);
          }
          else {
            local_88 = local_318;
            auStack_80._0_8_ = PStack_310.m_string.d.d;
            auStack_80._8_8_ = PStack_310.m_string.d.ptr;
            if (local_318 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + 1;
              UNLOCK();
            }
          }
          uVar4 = auStack_80._8_8_;
          auVar26 = local_88;
          pDVar7 = PStack_310.m_string.d.d;
          auVar27 = local_318;
          local_88 = local_318;
          local_318 = auVar26;
          PStack_310.m_string.d.d = (Data *)auStack_80._0_8_;
          auStack_80._0_8_ = pDVar7;
          auStack_80._8_8_ = PStack_310.m_string.d.ptr;
          PStack_310.m_string.d.ptr = (char16_t *)uVar4;
          if (auVar27 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
            }
          }
        }
        PStack_350.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_358 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        PStack_350.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_2d8.d.d = (Data *)local_158;
        local_2d8.d.ptr = (char16_t *)local_318;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_388,(QStringBuilder<QString_&,_QString_&> *)&local_2d8);
        MakefileGenerator::fileFixify
                  ((QString *)local_2b8,&this->super_MakefileGenerator,(QString *)local_388,
                   (FileFixifyTypes)0x4,true);
        MakefileGenerator::filePrefixRoot
                  ((QString *)local_88,&this->super_MakefileGenerator,&local_108,
                   (QString *)local_2b8);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (local_358,this,(ProString *)local_88);
        auVar27 = local_88;
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if ((ProString *)local_2b8._0_8_ != (ProString *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&(((QString *)local_2b8._0_8_)->d).d)->_M_i =
               ((__atomic_base<int> *)&(((QString *)local_2b8._0_8_)->d).d)->_M_i + -1;
          UNLOCK();
          if (((__atomic_base<int> *)&(((QString *)local_2b8._0_8_)->d).d)->_M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
          }
        }
        if ((QMakeProject *)local_388._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_388._0_8_,2,0x10);
          }
        }
        local_88 = (undefined1  [8])anon_var_dwarf_2d72b5;
        auStack_80._0_8_ = local_358;
        ::operator+=(__return_storage_ptr__,
                     (QStringBuilder<const_char_(&)[25],_QString_&> *)local_88);
        if ((this_00->d).size != 0) {
          ProString::ProString((ProString *)local_88,"\n\t");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88)
          ;
          QList<ProString>::end(this_00);
          if (local_88 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_88,2,0x10);
            }
          }
        }
        local_2b8._0_8_ = "-$(DEL_FILE) ";
        local_2b8._8_8_ = local_358;
        ProString::ProString<char_const(&)[14],QString&>
                  ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_2b8)
        ;
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_88);
        QList<ProString>::end(this_00);
        if (local_88 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88,2,0x10);
          }
        }
        if (local_358 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
        if (local_318 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          }
        }
      }
      pPVar29 = (ProString *)((long)&(pPVar29->m_string).d.d + 1);
      lVar28 = lVar28 + 0x30;
    } while (pPVar29 < (ulong)local_178.size);
  }
  if ((QMakeProject *)local_258.d.d != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)
                  ->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)
                 ->d == 0) {
      QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_208 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_208,2,0x10);
    }
  }
  if ((QMakeProject *)local_1e8._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_1e8._0_8_,2,0x10);
    }
  }
  if (local_1c8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1c8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1c8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_1c8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_1c8,2,0x10);
    }
  }
  bVar11 = true;
  if (!bVar12) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_318,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_318);
    bVar11 = ProString::operator==((ProString *)local_88,"lib");
    if (local_88 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_88)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_88,2,0x10);
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_318)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
  }
  if (bVar11 != false) {
    local_1c8 = (undefined1  [8])0x0;
    pQStack_1c0 = (QMakeProject *)0x0;
    local_1b8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )0x0;
    QVar41.m_data = (storage_type *)0x3;
    QVar41.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar41);
    local_2b8._0_8_ = local_358;
    local_2b8._8_8_ = PStack_350.m_string.d.d;
    local_2b8._16_8_ = PStack_350.m_string.d.ptr;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)local_1c8,(qsizetype)local_1b8.d.d.ptr,
               (QString *)local_2b8);
    QList<QString>::end((QList<QString> *)local_1c8);
    QVar42.m_data = (storage_type *)0x7;
    QVar42.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar42);
    local_388._0_8_ = local_358;
    local_388._8_8_ = PStack_350.m_string.d.d;
    local_388._16_8_ = PStack_350.m_string.d.ptr;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)local_1c8,(qsizetype)local_1b8.d.d.ptr,
               (QString *)local_388);
    QList<QString>::end((QList<QString> *)local_1c8);
    QVar43.m_data = (storage_type *)0x9;
    QVar43.m_size = (qsizetype)local_358;
    QString::fromUtf8(QVar43);
    local_1e8._0_8_ = local_358;
    local_1e8._8_8_ = PStack_350.m_string.d.d;
    local_1d8 = (QMakeProject *)PStack_350.m_string.d.ptr;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)local_1c8,(qsizetype)local_1b8.d.d.ptr,
               (QString *)local_1e8);
    QList<QString>::end((QList<QString> *)local_1c8);
    if ((QMakeProject *)local_1e8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_1e8._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_388._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_388._0_8_,2,0x10);
      }
    }
    if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
      }
    }
    if (local_1b8.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )0x0) {
      lVar28 = 0x10;
      uVar23 = 0;
      do {
        local_1e8._0_8_ = *(undefined8 *)((long)pQStack_1c0 + lVar28 + -0x10);
        local_1e8._8_8_ = *(undefined8 *)((long)pQStack_1c0 + lVar28 + -8);
        local_1d8 = *(QMakeProject **)
                     ((long)&((DataPointer *)&(pQStack_1c0->super_QMakeEvaluator).m_caller)->d +
                     lVar28);
        if ((QMakeProject *)local_1e8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)
                   &(((QMakeProject *)local_1e8._0_8_)->super_QMakeEvaluator).m_caller)->d =
               *(int *)&((DataPointer *)
                        &(((QMakeProject *)local_1e8._0_8_)->super_QMakeEvaluator).m_caller)->d + 1;
          UNLOCK();
        }
        local_208 = (undefined1  [8])0x0;
        QStack_200.d = (Data *)0x0;
        local_1f8.d = (Data *)0x0;
        bVar11 = comparesEqual((QString *)local_1e8,"prl");
        bVar12 = true;
        if (bVar11) {
          pQVar1 = (this->super_MakefileGenerator).project;
          QVar44.m_data = (storage_type *)0xa;
          QVar44.m_size = (qsizetype)local_2b8;
          QString::fromUtf8(QVar44);
          config_07.m_data = (storage_type_conflict *)local_2b8._8_8_;
          config_07.m_size = local_2b8._16_8_;
          pQVar17 = (QMakeProject *)local_2b8._0_8_;
          bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_07,false);
          bVar12 = true;
          if (bVar14) {
            pQVar1 = (this->super_MakefileGenerator).project;
            QVar45.m_data = (storage_type *)0xe;
            QVar45.m_size = (qsizetype)local_2b8;
            QString::fromUtf8(QVar45);
            off = (int)local_2b8._0_8_;
            in_stack_fffffffffffffbcc = SUB84(local_2b8._0_8_,4);
            bVar12 = false;
            config_08.m_data = (storage_type_conflict *)local_2b8._8_8_;
            config_08.m_size = local_2b8._16_8_;
            bVar14 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_08,false);
            if (!bVar14) {
              pQVar1 = (this->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_358,"QMAKE_INTERNAL_PRL_FILE");
              bVar15 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_358);
              bVar15 = !bVar15;
              bVar14 = true;
              bVar12 = false;
              goto LAB_001b29bd;
            }
          }
          bVar14 = false;
          bVar15 = false;
        }
        else {
          bVar14 = false;
          bVar15 = false;
        }
LAB_001b29bd:
        pQVar2 = (QArrayData *)CONCAT44(in_stack_fffffffffffffbcc,off);
        if ((bVar14) && (local_358 != (undefined1  [8])0x0)) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_358)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_358,2,0x10);
          }
        }
        if (!bVar12 && pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar2,2,0x10);
          }
        }
        if (bVar11 && pQVar17 != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&(pQVar17->super_QMakeEvaluator).m_caller)->d =
               *(int *)&((DataPointer *)&(pQVar17->super_QMakeEvaluator).m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&(pQVar17->super_QMakeEvaluator).m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)pQVar17,2,0x10);
          }
        }
        if (bVar15) {
          MakefileGenerator::prlFileName((QString *)local_2b8,&this->super_MakefileGenerator,false);
          QVar8.d = QStack_200.d;
          auVar27 = local_208;
          uVar5 = local_2b8._16_8_;
          uVar4 = local_2b8._0_8_;
          local_2b8._0_8_ = local_208;
          local_208 = (undefined1  [8])uVar4;
          QStack_200.d = (Data *)local_2b8._8_8_;
          local_2b8._8_8_ = QVar8.d;
          local_2b8._16_8_ = local_1f8.d;
          local_1f8.d = (Data *)uVar5;
          if (auVar27 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
            }
          }
        }
        bVar12 = comparesEqual((QString *)local_1e8,"libtool");
        if (bVar12) {
          pQVar1 = (this->super_MakefileGenerator).project;
          QVar46.m_data = (storage_type *)0xe;
          QVar46.m_size = (qsizetype)local_2b8;
          QString::fromUtf8(QVar46);
          local_418 = (QMakeProject *)local_2b8._0_8_;
          config_09.m_data = (storage_type_conflict *)local_2b8._8_8_;
          config_09.m_size = local_2b8._16_8_;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_09,false);
        }
        else {
          bVar11 = false;
        }
        if (bVar12 && local_418 != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&(local_418->super_QMakeEvaluator).m_caller)->d =
               *(int *)&((DataPointer *)&(local_418->super_QMakeEvaluator).m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&(local_418->super_QMakeEvaluator).m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_418,2,0x10);
          }
        }
        if (bVar11 != false) {
          libtoolFileName((QString *)local_2b8,this,false);
          QVar8.d = QStack_200.d;
          auVar27 = local_208;
          uVar5 = local_2b8._16_8_;
          uVar4 = local_2b8._0_8_;
          local_2b8._0_8_ = local_208;
          local_208 = (undefined1  [8])uVar4;
          QStack_200.d = (Data *)local_2b8._8_8_;
          local_2b8._8_8_ = QVar8.d;
          local_2b8._16_8_ = local_1f8.d;
          local_1f8.d = (Data *)uVar5;
          if (auVar27 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
            }
          }
        }
        bVar12 = comparesEqual((QString *)local_1e8,"pkgconfig");
        if (bVar12) {
          pQVar1 = (this->super_MakefileGenerator).project;
          QVar47.m_data = (storage_type *)0x9;
          QVar47.m_size = (qsizetype)local_2b8;
          QString::fromUtf8(QVar47);
          local_400 = (QMakeProject *)local_2b8._0_8_;
          config_10.m_data = (storage_type_conflict *)local_2b8._8_8_;
          config_10.m_size = local_2b8._16_8_;
          bVar11 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config_10,false);
        }
        else {
          bVar11 = false;
        }
        if (bVar12 && local_400 != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&(local_400->super_QMakeEvaluator).m_caller)->d =
               *(int *)&((DataPointer *)&(local_400->super_QMakeEvaluator).m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&(local_400->super_QMakeEvaluator).m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_400,2,0x10);
          }
        }
        if (bVar11 != false) {
          MakefileGenerator::pkgConfigFileName
                    ((QString *)local_2b8,&this->super_MakefileGenerator,false);
          QVar8.d = QStack_200.d;
          auVar27 = local_208;
          uVar5 = local_2b8._16_8_;
          uVar4 = local_2b8._0_8_;
          local_2b8._0_8_ = local_208;
          local_208 = (undefined1  [8])uVar4;
          QStack_200.d = (Data *)local_2b8._8_8_;
          local_2b8._8_8_ = QVar8.d;
          local_2b8._16_8_ = local_1f8.d;
          local_1f8.d = (Data *)uVar5;
          if (auVar27 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar27)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar27,2,0x10);
            }
          }
        }
        if ((QMakeProject *)local_1f8.d != (QMakeProject *)0x0) {
          local_258.d.d = (Data *)local_208;
          local_258.d.ptr = (char16_t *)QStack_200.d;
          local_258.d.size = (qsizetype)local_1f8.d;
          if (local_208 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d + 1;
            UNLOCK();
          }
          if (local_118 != (ProFile *)0x0) {
            local_3a8.d.d = (Data *)local_128;
            local_3a8.d.ptr = (char16_t *)local_208;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      (&local_2d8,(QStringBuilder<QString_&,_QString_&> *)&local_3a8);
            local_2b8._0_8_ = local_2d8.d.d;
            local_2b8._8_8_ = local_2d8.d.ptr;
            local_2b8._16_8_ = local_2d8.d.size;
            if ((QMakeProject *)local_2d8.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d +
                   1;
              UNLOCK();
            }
            string_02.d.ptr = (char16_t *)pQVar17;
            string_02.d.d = (Data *)in_stack_fffffffffffffbb8;
            string_02.d.size._0_4_ = off;
            string_02.d.size._4_4_ = in_stack_fffffffffffffbcc;
            Option::fixString((QString *)local_388,string_02,(uchar)(MakefileGenerator *)local_2b8);
            if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0)
              {
                QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
              }
            }
            pcVar6 = local_258.d.ptr;
            pDVar7 = local_258.d.d;
            uVar5 = local_388._16_8_;
            uVar4 = local_388._0_8_;
            local_388._0_8_ = local_258.d.d;
            local_258.d.d = (Data *)uVar4;
            local_258.d.ptr = (char16_t *)local_388._8_8_;
            local_388._8_8_ = pcVar6;
            local_388._16_8_ = local_258.d.size;
            local_258.d.size = uVar5;
            if ((QMakeProject *)pDVar7 != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)->d
                   = *(int *)&((DataPointer *)
                              &((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)&pDVar7->super_QArrayData)->m_caller)
                           ->d == 0) {
                QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
              }
            }
            if ((QMakeProject *)local_2d8.d.d != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d =
                   *(int *)&((DataPointer *)
                            &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d +
                   -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)
                           &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d ==
                  0) {
                QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          local_2d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_2d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_2d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_3a8.d.d = (Data *)local_158;
          local_3a8.d.ptr = (char16_t *)local_208;
          QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                    ((QString *)local_388,(QStringBuilder<QString_&,_QString_&> *)&local_3a8);
          MakefileGenerator::fileFixify
                    ((QString *)local_2b8,&this->super_MakefileGenerator,(QString *)local_388,
                     (FileFixifyTypes)0x4,true);
          MakefileGenerator::filePrefixRoot
                    (&local_2d8,&this->super_MakefileGenerator,&local_108,(QString *)local_2b8);
          if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
            }
          }
          if ((QMakeProject *)local_388._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_388._0_8_,2,0x10);
            }
          }
          if ((this_00->d).size != 0) {
            ProString::ProString((ProString *)local_2b8,"\n\t");
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,
                       (ProString *)local_2b8);
            QList<ProString>::end(this_00);
            if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0)
              {
                QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
              }
            }
          }
          (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc]
          )(&local_3a8,this,&local_2d8);
          local_388._24_8_ = local_3a8.d.size;
          local_388._16_8_ = local_3a8.d.ptr;
          local_388._8_8_ = local_3a8.d.d;
          local_388._0_8_ = "-$(DEL_FILE) ";
          local_3a8.d.d = (Data *)0x0;
          local_3a8.d.ptr = (char16_t *)0x0;
          local_3a8.d.size = 0;
          ProString::ProString<char_const(&)[14],QString>
                    ((ProString *)local_2b8,(QStringBuilder<const_char_(&)[14],_QString> *)local_388
                    );
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_2b8
                    );
          QList<ProString>::end(this_00);
          if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_388._8_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_388._8_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_388._8_8_,2,0x10);
            }
          }
          if (&(local_3a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_3a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_3a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_3a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_3c0 = (QMakeProject *)local_2d8.d.d;
          local_3b8 = (QMakeProject *)local_2d8.d.ptr;
          QStack_3b0.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )local_2d8.d.size;
          if ((QMakeProject *)local_2d8.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d + 1;
            UNLOCK();
          }
          file_00.d.ptr = (char16_t *)pQVar17;
          file_00.d.d = (Data *)in_stack_fffffffffffffbb8;
          file_00.d.size._0_4_ = off;
          file_00.d.size._4_4_ = in_stack_fffffffffffffbcc;
          MakefileGenerator::fileInfo((MakefileGenerator *)local_2b8,file_00);
          QFileInfo::path();
          QFileInfo::~QFileInfo((QFileInfo *)local_2b8);
          if (local_3c0 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(local_3c0->super_QMakeEvaluator).m_caller)->d =
                 *(int *)&((DataPointer *)&(local_3c0->super_QMakeEvaluator).m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&(local_3c0->super_QMakeEvaluator).m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_3c0,2,0x10);
            }
          }
          if ((undefined1 *)local_3a8.d.size != (undefined1 *)0x0) {
            if ((__return_storage_ptr__->d).size != 0) {
              QString::append(__return_storage_ptr__,"\n\t",2);
            }
            MakefileGenerator::mkdir_p_asstring
                      ((QString *)local_2b8,&this->super_MakefileGenerator,&local_3a8,true);
            QString::append((QString *)__return_storage_ptr__);
            if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0)
              {
                QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
              }
            }
          }
          if ((__return_storage_ptr__->d).size != 0) {
            QString::append(__return_storage_ptr__,"\n\t",2);
          }
          QString::toUpper_helper((QString *)&local_3f8);
          local_388._24_8_ = local_3e8;
          local_388._16_8_ = pQStack_3f0;
          local_388._8_8_ = local_3f8;
          local_3e8 = 0;
          local_388._0_8_ = "QMAKE_";
          local_3f8 = (QMakeProject *)0x0;
          pQStack_3f0 = (QMakeProject *)0x0;
          local_368 = (char (*) [17])0x2a8b52;
          ProString::ProString<QStringBuilder<char_const(&)[7],QString>,char_const(&)[17]>
                    ((ProString *)local_2b8,
                     (QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>
                      *)local_388);
          MakefileGenerator::installMetaFile
                    (&local_3d8,&this->super_MakefileGenerator,(ProKey *)local_2b8,&local_258,
                     &local_2d8);
          QString::append((QString *)__return_storage_ptr__);
          if (&(local_3d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_3d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_3d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeProject *)local_2b8._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2b8._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2b8._0_8_,2,0x10);
            }
          }
          if ((QMakeProject *)local_388._8_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._8_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._8_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_388._8_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_388._8_8_,2,0x10);
            }
          }
          if (local_3f8 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(local_3f8->super_QMakeEvaluator).m_caller)->d =
                 *(int *)&((DataPointer *)&(local_3f8->super_QMakeEvaluator).m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&(local_3f8->super_QMakeEvaluator).m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_3f8,2,0x10);
            }
          }
          if (&(local_3a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_3a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_3a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeProject *)local_2d8.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d + -1
            ;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_2d8.d.d)->super_QArrayData)->m_caller)->d == 0)
            {
              QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeProject *)local_258.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)->d + -1
            ;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_258.d.d)->super_QArrayData)->m_caller)->d == 0)
            {
              QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (local_208 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_208)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_208,2,0x10);
          }
        }
        if ((QMakeProject *)local_1e8._0_8_ != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_1e8._0_8_)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_1e8._0_8_,2,0x10);
          }
        }
        uVar23 = uVar23 + 1;
        lVar28 = lVar28 + 0x18;
      } while (uVar23 < (ulong)local_1b8.d.d.ptr);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_1c8);
  }
  if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )local_198._0_8_ !=
      (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_198._0_8_ = *(int *)local_198._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_198._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_198._0_8_,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_178);
  if ((QMakeProject *)local_158._0_8_ != (QMakeProject *)0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_158._0_8_)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_158._0_8_)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_158._0_8_)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_158._0_8_,2,0x10);
    }
  }
  if ((QMakeEvaluator *)local_128._0_8_ != (QMakeEvaluator *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
    }
  }
  piVar3 = (int *)CONCAT44(local_108.d.d._4_4_,(int)local_108.d.d);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_108.d.d._4_4_,(int)local_108.d.d),2,0x10);
    }
  }
LAB_001b34ab:
  if ((QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
       )((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          *)(in_FS_OFFSET + 0x28))->ptr == local_38.d.d.ptr) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
UnixMakefileGenerator::defaultInstall(const QString &t)
{
    if(t != "target" || project->first("TEMPLATE") == "subdirs")
        return QString();

    enum { NoBundle, SolidBundle, SlicedBundle } bundle = NoBundle;
    bool isAux = (project->first("TEMPLATE") == "aux");
    const QString root = installRoot();
    ProStringList &uninst = project->values(ProKey(t + ".uninstall"));
    QString ret, destdir = project->first("DESTDIR").toQString();
    if(!destdir.isEmpty() && destdir.right(1) != Option::dir_sep)
        destdir += Option::dir_sep;
    QString targetdir = fileFixify(project->first("target.path").toQString(), FileFixifyAbsolute);
    if(targetdir.right(1) != Option::dir_sep)
        targetdir += Option::dir_sep;

    ProStringList links;
    QString target="$(TARGET)";
    const ProStringList &targets = project->values(ProKey(t + ".targets"));
    if(!project->isEmpty("QMAKE_BUNDLE")) {
        target = project->first("QMAKE_BUNDLE").toQString();
        bundle = project->isActiveConfig("sliced_bundle") ? SlicedBundle : SolidBundle;
    } else if(project->first("TEMPLATE") == "app") {
        target = "$(QMAKE_TARGET)";
    } else if(project->first("TEMPLATE") == "lib") {
            if (!project->isActiveConfig("staticlib")
                    && !project->isActiveConfig("plugin")
                    && !project->isActiveConfig("unversioned_libname")) {
                if(project->isEmpty("QMAKE_HPUX_SHLIB")) {
                    links << "$(TARGET0)" << "$(TARGET1)" << "$(TARGET2)";
                } else {
                    links << "$(TARGET0)";
                }
            }
    }
    for(int i = 0; i < targets.size(); ++i) {
        QString src = targets.at(i).toQString(),
                dst = escapeFilePath(filePrefixRoot(root, targetdir + src.section('/', -1)));
        if(!ret.isEmpty())
            ret += "\n\t";
        ret += "$(QINSTALL) " + escapeFilePath(Option::fixPathToTargetOS(src, false)) + ' ' + dst;
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        uninst.append("-$(DEL_FILE) " + dst);
    }

    {
        QString src_targ = target;
        if(!destdir.isEmpty())
            src_targ = Option::fixPathToTargetOS(destdir + target, false);
        QString plain_targ = filePrefixRoot(root, fileFixify(targetdir + target, FileFixifyAbsolute));
        QString dst_targ = plain_targ;
        plain_targ = escapeFilePath(plain_targ);
        if (bundle != NoBundle) {
            QString suffix;
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isActiveConfig("shallow_bundle"))
                    suffix += "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION");
                suffix += "/$(TARGET)";
            } else {
                suffix = "/" + project->first("QMAKE_BUNDLE_LOCATION") + "/$(QMAKE_TARGET)";
            }
            dst_targ += suffix;
            if (bundle == SolidBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += "$(DEL_FILE) -r " + plain_targ + "\n\t";
            } else {
                src_targ += suffix;
            }
        }
        src_targ = escapeFilePath(src_targ);
        dst_targ = escapeFilePath(dst_targ);

        QString copy_cmd;
        if (bundle == SolidBundle) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + plain_targ;
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + dst_targ;
        } else if (!isAux) {
            if (bundle == SlicedBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst_targ + "`\"", false);
            }
            copy_cmd += "$(QINSTALL_PROGRAM) " + src_targ + ' ' + dst_targ;
        }
        if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib")
           && project->values(ProKey(t + ".CONFIG")).indexOf("fix_rpath") != -1) {
            if (!ret.isEmpty())
                ret += "\n\t";
            if(!project->isEmpty("QMAKE_FIX_RPATH")) {
                ret += copy_cmd;
                ret += "\n\t-" + var("QMAKE_FIX_RPATH") + ' ' + dst_targ + ' ' + dst_targ;
            } else if(!project->isEmpty("QMAKE_LFLAGS_RPATH")) {
                ret += "-$(LINK) $(LFLAGS) " + var("QMAKE_LFLAGS_RPATH") + targetdir + " -o " +
                       dst_targ + " $(OBJECTS) $(LIBS) $(OBJCOMP)";
            } else {
                ret += copy_cmd;
            }
        } else if (!copy_cmd.isEmpty()) {
            if (!ret.isEmpty())
                ret += "\n\t";
            ret += copy_cmd;
        }

        if (isAux) {
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            if(!project->isEmpty("QMAKE_RANLIB"))
                ret += QString("\n\t$(RANLIB) ") + dst_targ;
        } else if (!project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip")
                   && !project->isEmpty("QMAKE_STRIP")) {
            ret += "\n\t-$(STRIP)";
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_LIB"))
                    ret += " " + var("QMAKE_STRIPFLAGS_LIB");
            } else if (project->first("TEMPLATE") == "app") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_APP"))
                    ret += " " + var("QMAKE_STRIPFLAGS_APP");
            }
            ret += ' ' + dst_targ;
        }
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        if (bundle == SolidBundle)
            uninst.append("-$(DEL_FILE) -r " + plain_targ);
        else if (!isAux)
            uninst.append("-$(DEL_FILE) " + dst_targ);
        if (bundle == SlicedBundle) {
            int dstlen = project->first("DESTDIR").length();
            for (const ProString &src : project->values("QMAKE_BUNDLED_FILES")) {
                ProString file = src.mid(dstlen);
                QString dst = escapeFilePath(
                            filePrefixRoot(root, fileFixify(targetdir + file, FileFixifyAbsolute)));
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst + "`\"", false) + "\n\t";
                ret += "-$(DEL_FILE) " + dst + "\n\t"; // Can't overwrite symlinks to directories
                ret += "$(QINSTALL) " + escapeFilePath(src) + " " + dst;
                if (!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + dst);
            }
        }
        if(!links.isEmpty()) {
            for(int i = 0; i < links.size(); ++i) {
                if (target_mode == TARG_UNIX_MODE || target_mode == TARG_MAC_MODE) {
                    QString link = Option::fixPathToTargetOS(destdir + links[i], false);
                    int lslash = link.lastIndexOf(Option::dir_sep);
                    if(lslash != -1)
                        link = link.right(link.size() - (lslash + 1));
                    QString dst_link = escapeFilePath(
                                filePrefixRoot(root, fileFixify(targetdir + link, FileFixifyAbsolute)));
                    ret += "\n\t-$(SYMLINK) $(TARGET) " + dst_link;
                    if(!uninst.isEmpty())
                        uninst.append("\n\t");
                    uninst.append("-$(DEL_FILE) " + dst_link);
                }
            }
        }
    }
    if (isAux || project->first("TEMPLATE") == "lib") {
        QStringList types;
        types << "prl" << "libtool" << "pkgconfig";
        for(int i = 0; i < types.size(); ++i) {
            const QString type = types.at(i);
            QString meta;
            if(type == "prl" && project->isActiveConfig("create_prl") && !project->isActiveConfig("no_install_prl") &&
               !project->isEmpty("QMAKE_INTERNAL_PRL_FILE"))
                meta = prlFileName(false);
            if (type == "libtool" && project->isActiveConfig("create_libtool"))
                meta = libtoolFileName(false);
            if(type == "pkgconfig" && project->isActiveConfig("create_pc"))
                meta = pkgConfigFileName(false);
            if(!meta.isEmpty()) {
                QString src_meta = meta;
                if(!destdir.isEmpty())
                    src_meta = Option::fixPathToTargetOS(destdir + meta, false);
                QString dst_meta = filePrefixRoot(root, fileFixify(targetdir + meta, FileFixifyAbsolute));
                if(!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + escapeFilePath(dst_meta));
                const QString dst_meta_dir = fileInfo(dst_meta).path();
                if(!dst_meta_dir.isEmpty()) {
                    if(!ret.isEmpty())
                        ret += "\n\t";
                    ret += mkdir_p_asstring(dst_meta_dir, true);
                }
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += installMetaFile(ProKey("QMAKE_" + type.toUpper() + "_INSTALL_REPLACE"), src_meta, dst_meta);
            }
        }
    }
    return ret;
}